

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcSampleVariablesTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::SampleShadingExtensionCase::iterate(SampleShadingExtensionCase *this)

{
  GLSLVersion GVar1;
  TestLog *log;
  RenderContext *pRVar2;
  bool bVar3;
  TestError *pTVar4;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  allocator<char> aStack_308;
  allocator<char> local_307;
  allocator<char> local_306;
  allocator<char> local_305;
  allocator<char> local_304;
  allocator<char> local_303;
  allocator<char> local_302;
  allocator<char> local_301;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  ShaderProgram programRequire;
  ProgramSources local_f0;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_OES_sample_variables");
  if (bVar3) {
    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,
               "${VERSION_DECL}\nin highp vec4 a_position;\nvoid main()\n{\n    gl_Position = a_position;\n}\n"
               ,&local_301);
    GVar1 = this->m_glslVersion;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,glcts::fixed_sample_locations_values + 1,&local_302);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,glcts::fixed_sample_locations_values + 1,&local_303);
    specializeVersion(&local_200,&local_220,GVar1,&local_240,&local_260);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,local_200._M_dataplus._M_p,&local_304);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,
               "${VERSION_DECL}\n${OES_SV_RQ}out highp vec4 o_color;\nvoid main()\n{\n    for (int i = 0; i < (gl_MaxSamples + 31) / 32; ++i) {\n        gl_SampleMask[i] = gl_SampleMaskIn[i];\n    }\n    o_color = vec4(gl_SampleID, gl_SamplePosition.x, gl_SamplePosition.y, 1);\n}\n"
               ,&local_305);
    GVar1 = this->m_glslVersion;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,glcts::fixed_sample_locations_values + 1,&local_306);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,glcts::fixed_sample_locations_values + 1,&local_307);
    specializeVersion(&local_2a0,&local_2c0,GVar1,&local_2e0,&local_300);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,local_2a0._M_dataplus._M_p,&aStack_308);
    glu::makeVtxFragSources(&local_f0,&local_1e0,&local_280);
    glu::ShaderProgram::ShaderProgram(&programRequire,pRVar2,&local_f0);
    glu::ProgramSources::~ProgramSources(&local_f0);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    glu::operator<<(log,&programRequire);
    if (programRequire.m_program.m_info.linkOk == false) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                 ,0x91);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    glu::ShaderProgram::~ShaderProgram(&programRequire);
    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,
               "${VERSION_DECL}\nin highp vec4 a_position;\nvoid main()\n{\n    gl_Position = a_position;\n}\n"
               ,&local_301);
    GVar1 = this->m_glslVersion;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,glcts::fixed_sample_locations_values + 1,&local_302);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,glcts::fixed_sample_locations_values + 1,&local_303);
    specializeVersion(&local_200,&local_220,GVar1,&local_240,&local_260);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,local_200._M_dataplus._M_p,&local_304);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,
               "${VERSION_DECL}\n${OES_SV_EN}out highp vec4 o_color;\nvoid main()\n{\n#if !GL_OES_sample_variables\n    this is broken\n#endif\n    for (int i = 0; i < (gl_MaxSamples + 31) / 32; ++i) {\n        gl_SampleMask[i] = gl_SampleMaskIn[i];\n    }\n    o_color = vec4(gl_SampleID, gl_SamplePosition.x, gl_SamplePosition.y, 1);\n}\n"
               ,&local_305);
    GVar1 = this->m_glslVersion;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,glcts::fixed_sample_locations_values + 1,&local_306);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,glcts::fixed_sample_locations_values + 1,&local_307);
    specializeVersion(&local_2a0,&local_2c0,GVar1,&local_2e0,&local_300);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,local_2a0._M_dataplus._M_p,&aStack_308);
    glu::makeVtxFragSources(&local_f0,&local_1e0,&local_280);
    glu::ShaderProgram::ShaderProgram(&programRequire,pRVar2,&local_f0);
    glu::ProgramSources::~ProgramSources(&local_f0);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    glu::operator<<(log,&programRequire);
    if (programRequire.m_program.m_info.linkOk == false) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                 ,0xaa);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    glu::ShaderProgram::~ShaderProgram(&programRequire);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "GL_OES_sample_variables";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

SampleShadingExtensionCase::IterateResult SampleShadingExtensionCase::iterate()
{
	TestLog& log = m_testCtx.getLog();

	if (!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_variables"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_sample_variables");
		return STOP;
	}

	static char const* vss = "${VERSION_DECL}\n"
							 "in highp vec4 a_position;\n"
							 "void main()\n"
							 "{\n"
							 "    gl_Position = a_position;\n"
							 "}\n";

	{
		static char const* fss = "${VERSION_DECL}\n"
								 "${OES_SV_RQ}"
								 "out highp vec4 o_color;\n"
								 "void main()\n"
								 "{\n"
								 "    for (int i = 0; i < (gl_MaxSamples + 31) / 32; ++i) {\n"
								 "        gl_SampleMask[i] = gl_SampleMaskIn[i];\n"
								 "    }\n"
								 "    o_color = vec4(gl_SampleID, gl_SamplePosition.x, gl_SamplePosition.y, 1);\n"
								 "}\n";

		glu::ShaderProgram programRequire(m_context.getRenderContext(),
										  glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion).c_str(),
																  specializeVersion(fss, m_glslVersion).c_str()));
		log << programRequire;
		if (!programRequire.isOk())
		{
			TCU_FAIL("Compile failed");
		}
	}

	{
		static char const* fss = "${VERSION_DECL}\n"
								 "${OES_SV_EN}"
								 "out highp vec4 o_color;\n"
								 "void main()\n"
								 "{\n"
								 "#if !GL_OES_sample_variables\n"
								 "    this is broken\n"
								 "#endif\n"
								 "    for (int i = 0; i < (gl_MaxSamples + 31) / 32; ++i) {\n"
								 "        gl_SampleMask[i] = gl_SampleMaskIn[i];\n"
								 "    }\n"
								 "    o_color = vec4(gl_SampleID, gl_SamplePosition.x, gl_SamplePosition.y, 1);\n"
								 "}\n";

		glu::ShaderProgram programEnable(m_context.getRenderContext(),
										 glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion).c_str(),
																 specializeVersion(fss, m_glslVersion).c_str()));
		log << programEnable;
		if (!programEnable.isOk())
		{
			TCU_FAIL("Compile failed");
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}